

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O0

bool GlobOpt::DoArrayLengthHoist(Func *func)

{
  bool bVar1;
  uint sourceContextId;
  uint functionId;
  JITTimeProfileInfo *this;
  byte local_19;
  byte local_11;
  Func *func_local;
  
  bVar1 = DoArrayCheckHoist(func);
  local_11 = 0;
  if (bVar1) {
    sourceContextId = Func::GetSourceContextId(func);
    functionId = Func::GetLocalFunctionId(func);
    bVar1 = Js::Phases::IsEnabled
                      ((Phases *)&DAT_01eafdf0,ArrayLengthHoistPhase,sourceContextId,functionId);
    local_11 = 0;
    if (!bVar1) {
      bVar1 = Func::HasProfileInfo(func);
      local_19 = 1;
      if (bVar1) {
        this = Func::GetReadOnlyProfileInfo(func);
        bVar1 = Func::IsLoopBody(func);
        bVar1 = JITTimeProfileInfo::IsArrayLengthHoistDisabled(this,bVar1);
        local_19 = bVar1 ^ 0xff;
      }
      local_11 = local_19;
    }
  }
  return (bool)(local_11 & 1);
}

Assistant:

bool
GlobOpt::DoArrayLengthHoist(Func const * const func)
{
    return
        DoArrayCheckHoist(func) &&
        !PHASE_OFF(Js::Phase::ArrayLengthHoistPhase, func) &&
        (!func->HasProfileInfo() || !func->GetReadOnlyProfileInfo()->IsArrayLengthHoistDisabled(func->IsLoopBody()));
}